

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O1

SubstitutionTree * __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getTree
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *lit
          ,bool complementary)

{
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
  **ppuVar1;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
  *puVar2;
  ulong uVar3;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
  *puVar4;
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_false>
  local_30;
  
  uVar3 = (ulong)((uint)((((lit->super_Term)._args[0]._content & 4) == 0) != complementary) +
                 (lit->super_Term)._functor * 2);
  puVar2 = (this->_trees)._stack;
  puVar4 = (this->_trees)._cursor;
  if ((ulong)((long)puVar4 - (long)puVar2 >> 3) <= uVar3) {
    do {
      local_30._M_head_impl =
           (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)::operator_new(0x18);
      (local_30._M_head_impl)->_nextVar = 0;
      (local_30._M_head_impl)->_root = (Node *)0x0;
      if (puVar4 == (this->_trees)._end) {
        ::Lib::
        Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
        ::expand(&this->_trees);
      }
      (((this->_trees)._cursor)->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_false>
      ._M_head_impl = local_30._M_head_impl;
      local_30._M_head_impl = (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x0
      ;
      ppuVar1 = &(this->_trees)._cursor;
      *ppuVar1 = *ppuVar1 + 1;
      std::
      unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
      ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
                     *)&local_30);
      puVar2 = (this->_trees)._stack;
      puVar4 = (this->_trees)._cursor;
    } while ((ulong)((long)puVar4 - (long)puVar2 >> 3) <= uVar3);
  }
  return (SubstitutionTree *)
         puVar2[uVar3]._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_false>
         ._M_head_impl;
}

Assistant:

SubstitutionTree& getTree(Literal* lit, bool complementary)
  {
    auto findNegative = complementary ? lit->isPositive() : lit->isNegative();
    auto idx = toIdx(lit->functor(), findNegative);
    while (idx >= _trees.size()) {
      _trees.push(std::make_unique<SubstitutionTree>());
    }
    return *_trees[idx];
  }